

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int rtreeFilter(sqlite3_vtab_cursor *pVtabCursor,int idxNum,char *idxStr,int argc,
               sqlite3_value **argv)

{
  Rtree *pRtree;
  double dVar1;
  bool bVar2;
  sqlite3_vtab_cursor pNode;
  int iVar3;
  int iVar4;
  i64 iVar5;
  RtreeSearchPoint *pRVar6;
  sqlite3_vtab *psVar7;
  ulong uVar8;
  uint *__src;
  undefined8 *puVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  long in_FS_OFFSET;
  bool bVar14;
  i64 iNode;
  RtreeNode *pLeaf;
  int iCell;
  RtreeNode *pRoot;
  sqlite3_int64 local_58;
  sqlite3_vtab_cursor local_50;
  int local_44;
  sqlite3_vtab_cursor local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pRtree = (Rtree *)pVtabCursor->pVtab;
  local_40.pVtab = (sqlite3_vtab *)0x0;
  local_44 = 0;
  pRtree->nBusy = pRtree->nBusy + 1;
  resetCursor((RtreeCursor *)pVtabCursor);
  *(int *)((long)&pVtabCursor[1].pVtab + 4) = idxNum;
  if (idxNum == 1) {
    local_50.pVtab = (sqlite3_vtab *)&DAT_aaaaaaaaaaaaaaaa;
    iVar5 = sqlite3VdbeIntValue(*argv);
    local_58 = 0;
    iVar3 = sqlite3_value_numeric_type(*argv);
    if (iVar3 == 1) {
LAB_001f8a91:
      iVar3 = findLeafNode(pRtree,iVar5,(RtreeNode **)&local_50,&local_58);
    }
    else {
      if (iVar3 == 2) {
        dVar1 = sqlite3VdbeRealValue(*argv);
        iVar3 = sqlite3IntFloatCompare(iVar5,dVar1);
        if (iVar3 == 0) goto LAB_001f8a91;
      }
      local_50.pVtab = (sqlite3_vtab *)0x0;
      iVar3 = 0;
    }
    pNode.pVtab = local_50.pVtab;
    if ((RtreeNode *)local_50.pVtab == (RtreeNode *)0x0 || iVar3 != 0) {
      *(undefined1 *)&pVtabCursor[1].pVtab = 1;
    }
    else {
      pRVar6 = rtreeSearchPointNew((RtreeCursor *)pVtabCursor,0.0,'\0');
      pVtabCursor[0xb].pVtab = pNode.pVtab;
      pRVar6->id = local_58;
      pRVar6->eWithin = '\x01';
      iVar3 = nodeRowidIndex(pRtree,(RtreeNode *)pNode.pVtab,iVar5,&local_44);
      pRVar6->iCell = (u8)local_44;
    }
  }
  else {
    iVar3 = nodeAcquire(pRtree,1,(RtreeNode *)0x0,(RtreeNode **)&local_40);
    if (0 < argc && iVar3 == 0) {
      iVar3 = sqlite3_initialize();
      if (iVar3 == 0) {
        psVar7 = (sqlite3_vtab *)sqlite3Malloc((ulong)(uint)argc * 0x18);
      }
      else {
        psVar7 = (sqlite3_vtab *)0x0;
      }
      pVtabCursor[3].pVtab = psVar7;
      *(int *)&pVtabCursor[2].pVtab = argc;
      if (psVar7 == (sqlite3_vtab *)0x0) {
        iVar3 = 7;
      }
      else {
        memset(psVar7,0,(ulong)(uint)argc * 0x18);
        memset(pVtabCursor + 0x10,0,(long)pRtree->iDepth * 4 + 4);
        uVar8 = 1;
        if (1 < argc) {
          uVar8 = (ulong)(uint)argc;
        }
        lVar13 = 0x10;
        iVar3 = 0;
        lVar12 = 0;
        do {
          psVar7 = pVtabCursor[3].pVtab;
          iVar4 = sqlite3_value_numeric_type(argv[lVar12]);
          uVar11 = (uint)idxStr[lVar12 * 2];
          *(uint *)((long)psVar7 + lVar13 + -0xc) = uVar11;
          *(int *)((long)psVar7 + lVar13 + -0x10) = idxStr[lVar12 * 2 + 1] + -0x30;
          if ((int)uVar11 < 0x46) {
            if (iVar4 == 2) {
              dVar1 = sqlite3VdbeRealValue(argv[lVar12]);
              *(double *)((long)psVar7 + lVar13 + -8) = dVar1;
            }
            else if (iVar4 == 1) {
              iVar5 = sqlite3VdbeIntValue(argv[lVar12]);
              *(double *)((long)psVar7 + lVar13 + -8) = (double)iVar5;
              if (iVar5 - 0x1000000000000U < 0xfffe000000000001) {
                if (*(int *)((long)psVar7 + lVar13 + -0xc) == 0x43) {
                  *(undefined4 *)((long)psVar7 + lVar13 + -0xc) = 0x42;
                }
                if (*(int *)((long)psVar7 + lVar13 + -0xc) == 0x45) {
                  *(undefined4 *)((long)psVar7 + lVar13 + -0xc) = 0x44;
                }
              }
            }
            else {
              *(undefined8 *)((long)psVar7 + lVar13 + -8) = 0;
              if ((iVar4 == 5) || ((uVar11 & 0xfffffffe) != 0x42)) {
                *(undefined4 *)((long)psVar7 + lVar13 + -0xc) = 0x40;
              }
              else {
                *(undefined4 *)((long)psVar7 + lVar13 + -0xc) = 0x3f;
              }
            }
LAB_001f8d85:
            bVar2 = false;
          }
          else {
            __src = (uint *)sqlite3_value_pointer(argv[lVar12],"RtreeMatchArg");
            if (__src == (uint *)0x0) {
              iVar3 = 1;
LAB_001f8d5a:
              bVar14 = false;
            }
            else {
              uVar11 = *__src;
              iVar3 = sqlite3_initialize();
              if (iVar3 == 0) {
                puVar9 = (undefined8 *)sqlite3Malloc((ulong)uVar11 + 0x70);
              }
              else {
                puVar9 = (undefined8 *)0x0;
              }
              if (puVar9 == (undefined8 *)0x0) {
                iVar3 = 7;
                goto LAB_001f8d5a;
              }
              puVar9[0xc] = 0;
              puVar9[0xd] = 0;
              puVar9[10] = 0;
              puVar9[0xb] = 0;
              puVar9[8] = 0;
              puVar9[9] = 0;
              puVar9[6] = 0;
              puVar9[7] = 0;
              puVar9[4] = 0;
              puVar9[5] = 0;
              puVar9[2] = 0;
              puVar9[3] = 0;
              *puVar9 = 0;
              puVar9[1] = 0;
              memcpy(puVar9 + 0xe,__src,(ulong)*__src);
              lVar10 = puVar9[0xf];
              *puVar9 = puVar9[0x12];
              *(undefined4 *)(puVar9 + 1) = *(undefined4 *)(puVar9 + 0x13);
              puVar9[2] = puVar9 + 0x15;
              puVar9[0xd] = puVar9[0x14];
              if (lVar10 == 0) {
                *(undefined4 *)((long)psVar7 + lVar13 + -0xc) = 0x47;
                lVar10 = puVar9[0x10];
              }
              *(long *)((long)psVar7 + lVar13 + -8) = lVar10;
              *(undefined8 **)((long)&psVar7->pModule + lVar13) = puVar9;
              iVar3 = 0;
              bVar14 = true;
            }
            bVar2 = true;
            if (bVar14) {
              lVar10 = *(long *)((long)&psVar7->pModule + lVar13);
              *(uint *)(lVar10 + 0x38) = (uint)pRtree->nDim2;
              *(sqlite3_vtab_cursor **)(lVar10 + 0x30) = pVtabCursor + 0x10;
              *(int *)(lVar10 + 0x40) = pRtree->iDepth + 1;
              iVar3 = 0;
              goto LAB_001f8d85;
            }
          }
          if (bVar2) break;
          lVar13 = lVar13 + 0x18;
          bVar14 = uVar8 - 1 != lVar12;
          lVar12 = lVar12 + 1;
        } while (bVar14);
      }
    }
    if (iVar3 == 0) {
      pRVar6 = rtreeSearchPointNew((RtreeCursor *)pVtabCursor,0.0,(char)pRtree->iDepth + '\x01');
      if (pRVar6 == (RtreeSearchPoint *)0x0) {
        iVar3 = 7;
        goto LAB_001f8e1b;
      }
      pRVar6->id = 1;
      pRVar6->eWithin = '\x01';
      pRVar6->iCell = '\0';
      pVtabCursor[0xb].pVtab = local_40.pVtab;
      local_40.pVtab = (sqlite3_vtab *)0x0;
      iVar3 = rtreeStepToLeaf((RtreeCursor *)pVtabCursor);
    }
  }
  nodeRelease(pRtree,(RtreeNode *)local_40.pVtab);
  rtreeRelease(pRtree);
LAB_001f8e1b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

static int rtreeFilter(
  sqlite3_vtab_cursor *pVtabCursor,
  int idxNum, const char *idxStr,
  int argc, sqlite3_value **argv
){
  Rtree *pRtree = (Rtree *)pVtabCursor->pVtab;
  RtreeCursor *pCsr = (RtreeCursor *)pVtabCursor;
  RtreeNode *pRoot = 0;
  int ii;
  int rc = SQLITE_OK;
  int iCell = 0;

  rtreeReference(pRtree);

  /* Reset the cursor to the same state as rtreeOpen() leaves it in. */
  resetCursor(pCsr);

  pCsr->iStrategy = idxNum;
  if( idxNum==1 ){
    /* Special case - lookup by rowid. */
    RtreeNode *pLeaf;        /* Leaf on which the required cell resides */
    RtreeSearchPoint *p;     /* Search point for the leaf */
    i64 iRowid = sqlite3_value_int64(argv[0]);
    i64 iNode = 0;
    int eType = sqlite3_value_numeric_type(argv[0]);
    if( eType==SQLITE_INTEGER
     || (eType==SQLITE_FLOAT
         && 0==sqlite3IntFloatCompare(iRowid,sqlite3_value_double(argv[0])))
    ){
      rc = findLeafNode(pRtree, iRowid, &pLeaf, &iNode);
    }else{
      rc = SQLITE_OK;
      pLeaf = 0;
    }
    if( rc==SQLITE_OK && pLeaf!=0 ){
      p = rtreeSearchPointNew(pCsr, RTREE_ZERO, 0);
      assert( p!=0 );  /* Always returns pCsr->sPoint */
      pCsr->aNode[0] = pLeaf;
      p->id = iNode;
      p->eWithin = PARTLY_WITHIN;
      rc = nodeRowidIndex(pRtree, pLeaf, iRowid, &iCell);
      p->iCell = (u8)iCell;
      RTREE_QUEUE_TRACE(pCsr, "PUSH-F1:");
    }else{
      pCsr->atEOF = 1;
    }
  }else{
    /* Normal case - r-tree scan. Set up the RtreeCursor.aConstraint array
    ** with the configured constraints.
    */
    rc = nodeAcquire(pRtree, 1, 0, &pRoot);
    if( rc==SQLITE_OK && argc>0 ){
      pCsr->aConstraint = sqlite3_malloc64(sizeof(RtreeConstraint)*argc);
      pCsr->nConstraint = argc;
      if( !pCsr->aConstraint ){
        rc = SQLITE_NOMEM;
      }else{
        memset(pCsr->aConstraint, 0, sizeof(RtreeConstraint)*argc);
        memset(pCsr->anQueue, 0, sizeof(u32)*(pRtree->iDepth + 1));
        assert( (idxStr==0 && argc==0)
                || (idxStr && (int)strlen(idxStr)==argc*2) );
        for(ii=0; ii<argc; ii++){
          RtreeConstraint *p = &pCsr->aConstraint[ii];
          int eType = sqlite3_value_numeric_type(argv[ii]);
          p->op = idxStr[ii*2];
          p->iCoord = idxStr[ii*2+1]-'0';
          if( p->op>=RTREE_MATCH ){
            /* A MATCH operator. The right-hand-side must be a blob that
            ** can be cast into an RtreeMatchArg object. One created using
            ** an sqlite3_rtree_geometry_callback() SQL user function.
            */
            rc = deserializeGeometry(argv[ii], p);
            if( rc!=SQLITE_OK ){
              break;
            }
            p->pInfo->nCoord = pRtree->nDim2;
            p->pInfo->anQueue = pCsr->anQueue;
            p->pInfo->mxLevel = pRtree->iDepth + 1;
          }else if( eType==SQLITE_INTEGER ){
            sqlite3_int64 iVal = sqlite3_value_int64(argv[ii]);
#ifdef SQLITE_RTREE_INT_ONLY
            p->u.rValue = iVal;
#else
            p->u.rValue = (double)iVal;
            if( iVal>=((sqlite3_int64)1)<<48
             || iVal<=-(((sqlite3_int64)1)<<48)
            ){
              if( p->op==RTREE_LT ) p->op = RTREE_LE;
              if( p->op==RTREE_GT ) p->op = RTREE_GE;
            }
#endif
          }else if( eType==SQLITE_FLOAT ){
#ifdef SQLITE_RTREE_INT_ONLY
            p->u.rValue = sqlite3_value_int64(argv[ii]);
#else
            p->u.rValue = sqlite3_value_double(argv[ii]);
#endif
          }else{
            p->u.rValue = RTREE_ZERO;
            if( eType==SQLITE_NULL ){
              p->op = RTREE_FALSE;
            }else if( p->op==RTREE_LT || p->op==RTREE_LE ){
              p->op = RTREE_TRUE;
            }else{
              p->op = RTREE_FALSE;
            }
          }
        }
      }
    }
    if( rc==SQLITE_OK ){
      RtreeSearchPoint *pNew;
      assert( pCsr->bPoint==0 );  /* Due to the resetCursor() call above */
      pNew = rtreeSearchPointNew(pCsr, RTREE_ZERO, (u8)(pRtree->iDepth+1));
      if( NEVER(pNew==0) ){       /* Because pCsr->bPoint was FALSE */
        return SQLITE_NOMEM;
      }
      pNew->id = 1;
      pNew->iCell = 0;
      pNew->eWithin = PARTLY_WITHIN;
      assert( pCsr->bPoint==1 );
      pCsr->aNode[0] = pRoot;
      pRoot = 0;
      RTREE_QUEUE_TRACE(pCsr, "PUSH-Fm:");
      rc = rtreeStepToLeaf(pCsr);
    }
  }

  nodeRelease(pRtree, pRoot);
  rtreeRelease(pRtree);
  return rc;
}